

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_b10_sx_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint8_t *puVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  long lVar4;
  undefined1 in_XMM0 [16];
  undefined1 auVar5 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  
  auVar5 = pmovzxbw(in_XMM0,0xffffffffffffffff);
  auVar6 = pmovsxbw(in_XMM1,0x4040404040404040);
  do {
    if (0 < w) {
      lVar4 = 0;
      do {
        puVar1 = mask + lVar4 * 2;
        auVar7[0] = pavgb(puVar1[1],*puVar1);
        auVar7[1] = pavgb(0,puVar1[1]);
        auVar7[2] = pavgb(puVar1[3],puVar1[2]);
        auVar7[3] = pavgb(0,puVar1[3]);
        auVar7[4] = pavgb(puVar1[5],puVar1[4]);
        auVar7[5] = pavgb(0,puVar1[5]);
        auVar7[6] = pavgb(puVar1[7],puVar1[6]);
        auVar7[7] = pavgb(0,puVar1[7]);
        auVar7[8] = pavgb(puVar1[9],puVar1[8]);
        auVar7[9] = pavgb(0,puVar1[9]);
        auVar7[10] = pavgb(puVar1[0xb],puVar1[10]);
        auVar7[0xb] = pavgb(0,puVar1[0xb]);
        auVar7[0xc] = pavgb(puVar1[0xd],puVar1[0xc]);
        auVar7[0xd] = pavgb(0,puVar1[0xd]);
        auVar7[0xe] = pavgb(puVar1[0xf],puVar1[0xe]);
        auVar7[0xf] = pavgb(0,puVar1[0xf]);
        auVar7 = auVar7 & auVar5;
        puVar2 = src0 + lVar4;
        puVar3 = src1 + lVar4;
        uVar8 = pavgw((ushort)(*puVar2 * auVar7._0_2_ + *puVar3 * (auVar6._0_2_ - auVar7._0_2_)) >>
                      5,0);
        uVar9 = pavgw((ushort)(puVar2[1] * auVar7._2_2_ + puVar3[1] * (auVar6._2_2_ - auVar7._2_2_))
                      >> 5,0);
        uVar10 = pavgw((ushort)(puVar2[2] * auVar7._4_2_ + puVar3[2] * (auVar6._4_2_ - auVar7._4_2_)
                               ) >> 5,0);
        uVar11 = pavgw((ushort)(puVar2[3] * auVar7._6_2_ + puVar3[3] * (auVar6._6_2_ - auVar7._6_2_)
                               ) >> 5,0);
        uVar12 = pavgw((ushort)(puVar2[4] * auVar7._8_2_ + puVar3[4] * (auVar6._8_2_ - auVar7._8_2_)
                               ) >> 5,0);
        uVar13 = pavgw((ushort)(puVar2[5] * auVar7._10_2_ +
                               puVar3[5] * (auVar6._10_2_ - auVar7._10_2_)) >> 5,0);
        uVar14 = pavgw((ushort)(puVar2[6] * auVar7._12_2_ +
                               puVar3[6] * (auVar6._12_2_ - auVar7._12_2_)) >> 5,0);
        uVar15 = pavgw((ushort)(puVar2[7] * auVar7._14_2_ +
                               puVar3[7] * (auVar6._14_2_ - auVar7._14_2_)) >> 5,0);
        puVar2 = dst + lVar4;
        *puVar2 = uVar8;
        puVar2[1] = uVar9;
        puVar2[2] = uVar10;
        puVar2[3] = uVar11;
        puVar2[4] = uVar12;
        puVar2[5] = uVar13;
        puVar2[6] = uVar14;
        puVar2[7] = uVar15;
        lVar4 = lVar4 + 8;
      } while ((int)lVar4 < w);
    }
    mask = mask + mask_stride;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b10_sx_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_sx_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                                  src1_stride, mask, mask_stride, w, h,
                                  blend_8_b10);
}